

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

float ImGui::ScaleRatioFromValueT<float,float,float>
                (ImGuiDataType data_type,float v,float v_min,float v_max,bool is_logarithmic,
                float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  float fVar13;
  undefined1 in_register_00001204 [60];
  undefined1 auVar15 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 in_register_00001284 [60];
  undefined1 auVar19 [16];
  undefined1 in_register_000012c4 [60];
  undefined1 auVar20 [64];
  int iVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar18 [64];
  
  auVar20._4_60_ = in_register_000012c4;
  auVar20._0_4_ = logarithmic_zero_epsilon;
  auVar18._4_60_ = in_register_00001284;
  auVar18._0_4_ = v_max;
  auVar17 = auVar18._0_16_;
  auVar16._4_60_ = in_register_00001244;
  auVar16._0_4_ = v_min;
  auVar12 = auVar16._0_16_;
  auVar15._4_60_ = in_register_00001204;
  auVar15._0_4_ = v;
  if ((v_min == v_max) && (!NAN(v_min) && !NAN(v_max))) {
    return 0.0;
  }
  auVar11 = vminss_avx(auVar12,auVar17);
  auVar7 = vmaxss_avx(auVar17,auVar12);
  auVar7 = vminss_avx(auVar7,auVar15._0_16_);
  uVar2 = vcmpss_avx512f(auVar15._0_16_,auVar11,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  auVar7._0_4_ = (float)((uint)bVar3 * auVar11._0_4_ + (uint)!bVar3 * auVar7._0_4_);
  if (!is_logarithmic) {
    return (auVar7._0_4_ - v_min) / (v_max - v_min);
  }
  auVar11 = vmaxss_avx(auVar12,auVar17);
  auVar14 = ZEXT816(0) << 0x40;
  auVar1._8_4_ = 0x7fffffff;
  auVar1._0_8_ = 0x7fffffff7fffffff;
  auVar1._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx512vl(auVar11,auVar1);
  auVar10._8_4_ = 0x80000000;
  auVar10._0_8_ = 0x8000000080000000;
  auVar10._12_4_ = 0x80000000;
  auVar19 = auVar20._0_16_;
  auVar9 = vxorps_avx512vl(auVar19,auVar10);
  auVar1 = vminss_avx(auVar17,auVar12);
  fVar23 = auVar11._0_4_;
  bVar4 = fVar23 < 0.0;
  fVar13 = auVar1._0_4_;
  iVar21 = auVar9._0_4_;
  uVar2 = vcmpss_avx512f(auVar8,auVar19,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  fVar6 = (float)((uint)bVar3 *
                  ((uint)bVar4 * iVar21 + (uint)!bVar4 * (int)logarithmic_zero_epsilon) +
                 (uint)!bVar3 * (int)fVar23);
  if (!bVar4 || fVar13 != 0.0) {
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar10 = vandps_avx512vl(auVar1,auVar8);
    bVar5 = fVar13 < 0.0;
    uVar2 = vcmpss_avx512f(auVar10,auVar19,1);
    bVar3 = (bool)((byte)uVar2 & 1);
    uVar2 = vcmpss_avx512f(auVar11,auVar14,0);
    bVar4 = (bool)((byte)uVar2 & 1);
    auVar9._4_12_ = auVar1._4_12_;
    auVar9._0_4_ = (uint)bVar3 *
                   ((uint)bVar5 * iVar21 + (uint)!bVar5 * (int)logarithmic_zero_epsilon) +
                   (uint)!bVar3 * (int)fVar13;
    fVar6 = (float)((uint)bVar4 * ((uint)bVar5 * iVar21 + (uint)!bVar5 * (int)fVar6) +
                   (uint)!bVar4 * (int)fVar6);
  }
  fVar22 = auVar9._0_4_;
  if (fVar22 < auVar7._0_4_) {
    if (fVar6 <= auVar7._0_4_) {
      auVar14 = SUB6416(ZEXT464(0x3f800000),0);
    }
    else {
      if (0.0 <= v_min * v_max) {
        if ((fVar13 < 0.0) || (fVar23 < 0.0)) {
          fVar13 = logf(auVar7._0_4_ / fVar6);
          fVar6 = logf(fVar22 / fVar6);
          auVar14 = ZEXT416((uint)(1.0 - fVar13 / fVar6));
        }
        else {
          fVar13 = logf(auVar7._0_4_ / fVar22);
          fVar6 = logf(fVar6 / fVar22);
          auVar14 = ZEXT416((uint)(fVar13 / fVar6));
        }
      }
      else {
        auVar11._8_4_ = 0x80000000;
        auVar11._0_8_ = 0x8000000080000000;
        auVar11._12_4_ = 0x80000000;
        auVar11 = vxorps_avx512vl(auVar1,auVar11);
        auVar14._0_4_ = auVar11._0_4_ / (fVar23 - fVar13);
        auVar14._4_12_ = auVar11._4_12_;
        if ((v == 0.0) && (!NAN(v))) goto LAB_003012cc;
        if (0.0 <= v) {
          fVar13 = logf(auVar7._0_4_ / logarithmic_zero_epsilon);
          fVar6 = logf(fVar6 / logarithmic_zero_epsilon);
          auVar12._0_4_ = fVar13 / fVar6;
          auVar12._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar14 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - (auVar14._0_4_ + zero_deadzone_halfsize))),
                                    auVar12,ZEXT416((uint)(auVar14._0_4_ + zero_deadzone_halfsize)))
          ;
        }
        else {
          auVar17._8_4_ = 0x80000000;
          auVar17._0_8_ = 0x8000000080000000;
          auVar17._12_4_ = 0x80000000;
          auVar12 = vxorps_avx512vl(auVar7,auVar17);
          fVar6 = logf(auVar12._0_4_ / logarithmic_zero_epsilon);
          auVar19._8_4_ = 0x80000000;
          auVar19._0_8_ = 0x8000000080000000;
          auVar19._12_4_ = 0x80000000;
          auVar12 = vxorps_avx512vl(auVar9,auVar19);
          fVar13 = logf(auVar12._0_4_ / logarithmic_zero_epsilon);
          auVar14 = ZEXT416((uint)((1.0 - fVar6 / fVar13) * (auVar14._0_4_ - zero_deadzone_halfsize)
                                  ));
        }
      }
      auVar17 = ZEXT416((uint)v_max);
      auVar12 = ZEXT416((uint)v_min);
    }
  }
LAB_003012cc:
  uVar2 = vcmpss_avx512f(auVar17,auVar12,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  return (float)((uint)bVar3 * (int)(1.0 - auVar14._0_4_) + (uint)!bVar3 * (int)auVar14._0_4_);
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}